

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessTextureDeclaration
          (ConversionStream *this,iterator *Token,
          vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
          *Samplers,ObjectsTypeHashType *Objects,char *SamplerSuffix,Uint32 *ImageBinding)

{
  TokenListType *this_00;
  _List_node_base **pp_Var1;
  iterator iVar2;
  _List_node_base *p_Var3;
  const_iterator __position;
  byte bVar4;
  int iVar5;
  ostream *poVar6;
  const_iterator cVar7;
  uint uVar8;
  char (*Args_1) [39];
  char (*Args_1_00) [137];
  _List_node_base *p_Var9;
  __normal_iterator<const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_*,_std::vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>_>
  __tmp;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  uint uVar10;
  byte bVar11;
  Uint32 UVar12;
  Uint32 NumComponents;
  String ImgFormat;
  String GLSLSampler;
  String LayoutQualifier;
  String CompleteGLSLSampler;
  string err;
  uint local_2f4;
  HLSLObjectInfo local_2f0;
  ConversionStream *local_2c8;
  _List_node_base *local_2c0;
  char *local_2b8;
  long local_2b0;
  char local_2a8;
  undefined7 uStack_2a7;
  undefined1 *local_298;
  long local_290;
  undefined1 local_288;
  undefined7 uStack_287;
  char (*local_278) [39];
  undefined8 local_270;
  char local_268;
  char acStack_267 [15];
  Uint32 *local_258;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  long local_248;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240 [2];
  _List_node_base *local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  ulong local_208;
  vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
  *local_200;
  char *local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  char local_1e8;
  undefined7 uStack_1e7;
  size_type sStack_1e0;
  HashMapStringKey local_1d8;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [9];
  undefined7 uStack_1af;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1a8;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  size_t local_180;
  ios_base local_148 [264];
  char *local_40;
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_38;
  
  local_2c0 = Token->_M_node;
  local_208 = (ulong)*(uint *)&local_2c0[1]._M_next;
  uVar10 = *(uint *)&local_2c0[1]._M_next - 0x103;
  local_2b8 = &local_2a8;
  local_2b0 = 0;
  local_2a8 = '\0';
  p_Var9 = Token->_M_node->_M_next;
  Token->_M_node = p_Var9;
  this_00 = &this->m_Tokens;
  local_2c8 = this;
  local_258 = ImageBinding;
  local_200 = Samplers;
  local_40 = SamplerSuffix;
  local_38 = (_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)Objects;
  if (p_Var9 == (_List_node_base *)this_00) {
    FormatString<char[19],std::__cxx11::string,char[13]>
              ((string *)local_1c8,(Diligent *)"Unexpected EOF in ",
               (char (*) [19])&local_2c0[1]._M_prev,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6ec354,
               (char (*) [13])SamplerSuffix);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_2f0.GLSLType,local_2c8,Token,4);
    SamplerSuffix = local_1c8;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x543,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      SamplerSuffix,(char (*) [2])0x6e9945,&local_2f0.GLSLType);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0.GLSLType._M_dataplus._M_p != &local_2f0.GLSLType.field_2) {
      operator_delete(local_2f0.GLSLType._M_dataplus._M_p,
                      local_2f0.GLSLType.field_2._M_allocated_capacity + 1);
    }
    if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
      operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
    }
  }
  bVar11 = uVar10 < 8 & 0xf9U >> ((byte)uVar10 & 0x1f);
  iVar2 = (iterator)Token->_M_node;
  local_298 = &local_288;
  local_290 = 0;
  local_288 = 0;
  Args_1 = (char (*) [39])&local_268;
  local_270 = 0;
  local_268 = '\0';
  local_2f4 = 0;
  local_278 = Args_1;
  iVar5 = std::__cxx11::string::compare((char *)&Token->_M_node[1]._M_prev);
  if (iVar5 == 0) {
    if (*(int *)&Token->_M_node[1]._M_next != 0x145) {
      FormatString<char[26],char[39]>
                ((string *)local_1c8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Token->Type == TokenType::ComparisonOp",Args_1);
      DebugAssertionFailed
                ((Char *)local_1c8._0_8_,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x54c);
      if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
        operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
      }
    }
    p_Var9 = Token->_M_node;
    *(undefined4 *)&p_Var9[1]._M_next = 0x139;
    p_Var9 = p_Var9->_M_next;
    Token->_M_node = p_Var9;
    if (p_Var9 == (_List_node_base *)this_00) {
      FormatString<char[19],std::__cxx11::string,char[13]>
                ((string *)local_1c8,(Diligent *)"Unexpected EOF in ",
                 (char (*) [19])&local_2c0[1]._M_prev,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6ec354,
                 (char (*) [13])SamplerSuffix);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_2f0.GLSLType,local_2c8,Token,4);
      SamplerSuffix = local_1c8;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x550,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        SamplerSuffix,(char (*) [2])0x6e9945,&local_2f0.GLSLType);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0.GLSLType._M_dataplus._M_p != &local_2f0.GLSLType.field_2) {
        operator_delete(local_2f0.GLSLType._M_dataplus._M_p,
                        local_2f0.GLSLType.field_2._M_allocated_capacity + 1);
      }
      if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
        operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
      }
    }
    if ((*(int *)&Token->_M_node[1]._M_next == 299) &&
       (p_Var9 = Token->_M_node->_M_next, Token->_M_node = p_Var9,
       p_Var9 == (_List_node_base *)this_00)) {
      FormatString<char[19],std::__cxx11::string,char[13]>
                ((string *)local_1c8,(Diligent *)"Unexpected EOF in ",
                 (char (*) [19])&local_2c0[1]._M_prev,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6ec354,
                 (char (*) [13])SamplerSuffix);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_2f0.GLSLType,local_2c8,Token,4);
      SamplerSuffix = local_1c8;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x557,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        SamplerSuffix,(char (*) [2])0x6e9945,&local_2f0.GLSLType);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0.GLSLType._M_dataplus._M_p != &local_2f0.GLSLType.field_2) {
        operator_delete(local_2f0.GLSLType._M_dataplus._M_p,
                        local_2f0.GLSLType.field_2._M_allocated_capacity + 1);
      }
      if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
        operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
      }
    }
    local_230 = Token->_M_node;
    if (0xbe < *(int *)&local_230[1]._M_next - 1U) {
      FormatString<char[42]>
                ((string *)local_1c8,(char (*) [42])"Texture format type must be built-in type");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_2f0.GLSLType,local_2c8,Token,4);
      SamplerSuffix = local_1c8;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x55d,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        SamplerSuffix,(char (*) [2])0x6e9945,&local_2f0.GLSLType);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0.GLSLType._M_dataplus._M_p != &local_2f0.GLSLType.field_2) {
        operator_delete(local_2f0.GLSLType._M_dataplus._M_p,
                        local_2f0.GLSLType.field_2._M_allocated_capacity + 1);
      }
      if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
        operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
      }
    }
    iVar5 = *(int *)&Token->_M_node[1]._M_next;
    uVar8 = iVar5 - 0x16;
    Args_1_00 = (char (*) [137])(ulong)uVar8;
    if (uVar8 < 5) {
      local_2f4 = uVar8;
      if (iVar5 == 0x16) {
LAB_002cbc99:
        local_2f4 = 1;
      }
    }
    else {
      Args_1_00 = (char (*) [137])(ulong)(iVar5 - 0x2bU);
      if (iVar5 - 0x2bU < 5) {
        std::__cxx11::string::push_back((char)&local_298);
        iVar5 = *(int *)&Token->_M_node[1]._M_next;
        if (iVar5 == 0x2b) goto LAB_002cbc99;
        local_2f4 = iVar5 - 0x2b;
      }
      else if (iVar5 - 0x40U < 5) {
        std::__cxx11::string::push_back((char)&local_298);
        iVar5 = *(int *)&Token->_M_node[1]._M_next;
        if (iVar5 == 0x40) goto LAB_002cbc99;
        local_2f4 = iVar5 - 0x40;
      }
      else {
        FormatString<std::__cxx11::string,char[137]>
                  ((string *)local_1c8,(Diligent *)&Token->_M_node[1]._M_prev,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   " is not valid texture component type\nOnly the following texture element types are supported: float[1,2,3,4], int[1,2,3,4], uint[1,2,3,4]"
                   ,Args_1_00);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_2f0.GLSLType,local_2c8,Token,4);
        SamplerSuffix = local_1c8;
        Args_1_00 = (char (*) [137])0x578;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessTextureDeclaration",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x578,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          SamplerSuffix,(char (*) [2])0x6e9945,&local_2f0.GLSLType);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0.GLSLType._M_dataplus._M_p != &local_2f0.GLSLType.field_2) {
          operator_delete(local_2f0.GLSLType._M_dataplus._M_p,
                          local_2f0.GLSLType.field_2._M_allocated_capacity + 1);
        }
        if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
          operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
        }
      }
    }
    if (3 < local_2f4 - 1) {
      FormatString<char[38],unsigned_int,char[9]>
                ((string *)local_1c8,(Diligent *)"Between 1 and 4 components expected, ",
                 (char (*) [38])&local_2f4,(uint *)" deduced",(char (*) [9])SamplerSuffix);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_2f0.GLSLType,local_2c8,Token,4);
      SamplerSuffix = local_1c8;
      Args_1_00 = (char (*) [137])0x57a;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x57a,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        SamplerSuffix,(char (*) [2])0x6e9945,&local_2f0.GLSLType);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0.GLSLType._M_dataplus._M_p != &local_2f0.GLSLType.field_2) {
        operator_delete(local_2f0.GLSLType._M_dataplus._M_p,
                        local_2f0.GLSLType.field_2._M_allocated_capacity + 1);
      }
      if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
        operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
      }
    }
    p_Var9 = Token->_M_node->_M_next;
    Token->_M_node = p_Var9;
    if (p_Var9 == (_List_node_base *)this_00) {
      FormatString<char[19],std::__cxx11::string,char[13]>
                ((string *)local_1c8,(Diligent *)"Unexpected EOF in ",
                 (char (*) [19])&local_2c0[1]._M_prev,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6ec354,
                 (char (*) [13])SamplerSuffix);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_2f0.GLSLType,local_2c8,Token,4);
      SamplerSuffix = local_1c8;
      Args_1_00 = (char (*) [137])0x57d;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x57d,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        SamplerSuffix,(char (*) [2])0x6e9945,&local_2f0.GLSLType);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0.GLSLType._M_dataplus._M_p != &local_2f0.GLSLType.field_2) {
        operator_delete(local_2f0.GLSLType._M_dataplus._M_p,
                        local_2f0.GLSLType.field_2._M_allocated_capacity + 1);
      }
      if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
        operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
      }
    }
    if ((((uint)local_208 & 0xfffffffe) == 0x120) &&
       (iVar5 = std::__cxx11::string::compare((char *)&Token->_M_node[1]._M_prev), iVar5 == 0)) {
      p_Var9 = Token->_M_node->_M_next;
      Token->_M_node = p_Var9;
      if (p_Var9 == (_List_node_base *)this_00) {
        FormatString<char[19],std::__cxx11::string,char[13]>
                  ((string *)local_1c8,(Diligent *)"Unexpected EOF in ",
                   (char (*) [19])&local_2c0[1]._M_prev,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6ec354,
                   (char (*) [13])SamplerSuffix);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_2f0.GLSLType,local_2c8,Token,4);
        SamplerSuffix = local_1c8;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessTextureDeclaration",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x587,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          SamplerSuffix,(char (*) [2])0x6e9945,&local_2f0.GLSLType);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0.GLSLType._M_dataplus._M_p != &local_2f0.GLSLType.field_2) {
          operator_delete(local_2f0.GLSLType._M_dataplus._M_p,
                          local_2f0.GLSLType.field_2._M_allocated_capacity + 1);
        }
        if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
          operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
        }
      }
      uVar8 = *(int *)&Token->_M_node[1]._M_next - 0x13b;
      Args_1_00 = (char (*) [137])(ulong)uVar8;
      if (1 < uVar8) {
        FormatString<char[34],std::__cxx11::string,char[13]>
                  ((string *)local_1c8,(Diligent *)"Number of samples is expected in ",
                   (char (*) [34])&local_2c0[1]._M_prev,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6ec354,
                   (char (*) [13])SamplerSuffix);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_2f0.GLSLType,local_2c8,Token,4);
        SamplerSuffix = local_1c8;
        Args_1_00 = (char (*) [137])0x58d;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessTextureDeclaration",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x58d,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          SamplerSuffix,(char (*) [2])0x6e9945,&local_2f0.GLSLType);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0.GLSLType._M_dataplus._M_p != &local_2f0.GLSLType.field_2) {
          operator_delete(local_2f0.GLSLType._M_dataplus._M_p,
                          local_2f0.GLSLType.field_2._M_allocated_capacity + 1);
        }
        if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
          operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
        }
      }
      p_Var9 = Token->_M_node->_M_next;
      Token->_M_node = p_Var9;
      if (p_Var9 == (_List_node_base *)this_00) {
        FormatString<char[19],std::__cxx11::string,char[13]>
                  ((string *)local_1c8,(Diligent *)"Unexpected EOF in ",
                   (char (*) [19])&local_2c0[1]._M_prev,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6ec354,
                   (char (*) [13])SamplerSuffix);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_2f0.GLSLType,local_2c8,Token,4);
        SamplerSuffix = local_1c8;
        Args_1_00 = (char (*) [137])0x591;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessTextureDeclaration",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x591,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          SamplerSuffix,(char (*) [2])0x6e9945,&local_2f0.GLSLType);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0.GLSLType._M_dataplus._M_p != &local_2f0.GLSLType.field_2) {
          operator_delete(local_2f0.GLSLType._M_dataplus._M_p,
                          local_2f0.GLSLType.field_2._M_allocated_capacity + 1);
        }
        if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
          operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
        }
      }
    }
    iVar5 = std::__cxx11::string::compare((char *)&Token->_M_node[1]._M_prev);
    if (iVar5 != 0) {
      FormatString<char[16],std::__cxx11::string,char[13]>
                ((string *)local_1c8,(Diligent *)"Missing \">\" in ",
                 (char (*) [16])&local_2c0[1]._M_prev,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6ec354,
                 (char (*) [13])SamplerSuffix);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_2f0.GLSLType,local_2c8,Token,4);
      SamplerSuffix = local_1c8;
      Args_1_00 = (char (*) [137])0x595;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x595,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        SamplerSuffix,(char (*) [2])0x6e9945,&local_2f0.GLSLType);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0.GLSLType._M_dataplus._M_p != &local_2f0.GLSLType.field_2) {
        operator_delete(local_2f0.GLSLType._M_dataplus._M_p,
                        local_2f0.GLSLType.field_2._M_allocated_capacity + 1);
      }
      if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
        operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
      }
    }
    if (*(int *)&Token->_M_node[1]._M_next != 0x145) {
      FormatString<char[26],char[39]>
                ((string *)local_1c8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Token->Type == TokenType::ComparisonOp",(char (*) [39])Args_1_00);
      DebugAssertionFailed
                ((Char *)local_1c8._0_8_,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x597);
      if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
        operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
      }
    }
    p_Var9 = Token->_M_node;
    *(undefined4 *)&p_Var9[1]._M_next = 0x13a;
    if (bVar11 != 0) {
      local_2f0.GLSLType._M_dataplus._M_p = (pointer)p_Var9[3]._M_prev;
      local_250._M_current =
           (char *)((long)&((_List_node_base *)local_2f0.GLSLType._M_dataplus._M_p)->_M_next +
                   (long)p_Var9[4]._M_next);
      Parsing::
      ExtractGLSLImageFormatFromComment<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((string *)local_1c8,(Parsing *)&local_2f0,&local_250,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_250._M_current);
      std::__cxx11::string::operator=((string *)&local_2b8,(string *)local_1c8);
      if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
        operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
      }
      if (local_2b0 == 0) {
        local_2f0.GLSLType._M_dataplus._M_p = (pointer)local_230[3]._M_prev;
        local_250._M_current =
             (char *)((long)&((_List_node_base *)local_2f0.GLSLType._M_dataplus._M_p)->_M_next +
                     (long)local_230[4]._M_next);
        Parsing::
        ExtractGLSLImageFormatFromComment<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)local_1c8,(Parsing *)&local_2f0,&local_250,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_230);
        std::__cxx11::string::operator=((string *)&local_2b8,(string *)local_1c8);
        if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
          operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
        }
      }
      if (local_2b0 != 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"layout(",7);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1b8,local_2b8,local_2b0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", binding=",10);
        *local_258 = *local_258 + 1;
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)&local_278,(string *)&local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0.GLSLType._M_dataplus._M_p != &local_2f0.GLSLType.field_2) {
          operator_delete(local_2f0.GLSLType._M_dataplus._M_p,
                          local_2f0.GLSLType.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
        std::ios_base::~ios_base(local_148);
      }
    }
    p_Var9 = Token->_M_node->_M_next;
    Token->_M_node = p_Var9;
    if (p_Var9 == (_List_node_base *)this_00) {
      FormatString<char[19],std::__cxx11::string,char[13]>
                ((string *)local_1c8,(Diligent *)"Unexpected EOF in ",
                 (char (*) [19])&local_2c0[1]._M_prev,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6ec354,
                 (char (*) [13])SamplerSuffix);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_2f0.GLSLType,local_2c8,Token,4);
      SamplerSuffix = local_1c8;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x5b2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        SamplerSuffix,(char (*) [2])0x6e9945,&local_2f0.GLSLType);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0.GLSLType._M_dataplus._M_p != &local_2f0.GLSLType.field_2) {
        operator_delete(local_2f0.GLSLType._M_dataplus._M_p,
                        local_2f0.GLSLType.field_2._M_allocated_capacity + 1);
      }
      if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
        operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
      }
    }
  }
  std::__cxx11::string::append((char *)&local_298);
  switch(uVar10) {
  case 1:
  case 2:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
switchD_002cc4fe_caseD_1:
    FormatString<char[24]>((string *)local_1c8,(char (*) [24])"Unexpected texture type");
    DebugAssertionFailed
              ((Char *)local_1c8._0_8_,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x5d4);
    if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
      operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
    }
    goto LAB_002cc5d5;
  case 3:
  case 0x19:
    break;
  case 4:
  case 0x1a:
    break;
  case 5:
  case 0x1b:
    break;
  case 6:
  case 0x1c:
    break;
  case 7:
  case 0x1f:
    break;
  case 0x1d:
    break;
  case 0x1e:
    break;
  case 0x20:
    break;
  case 0x21:
    break;
  default:
    if ((int)local_208 != 0xcf) goto switchD_002cc4fe_caseD_1;
  case 0:
  }
  std::__cxx11::string::append((char *)&local_298);
LAB_002cc5d5:
  p_Var9 = Token->_M_node;
  while (p_Var9 != iVar2._M_node) {
    p_Var3 = (iVar2._M_node)->_M_next;
    std::__cxx11::
    list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
    _M_erase(this_00,iVar2);
    iVar2._M_node = p_Var3;
  }
  local_258 = (Uint32 *)
              ((long)(local_200->
                     super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_200->
                    super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  do {
    if (*(int *)&Token->_M_node[1]._M_next != 0x13b) {
      FormatString<char[24],std::__cxx11::string,char[13]>
                ((string *)local_1c8,(Diligent *)"Identifier expected in ",
                 (char (*) [24])&local_2c0[1]._M_prev,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6ec354,
                 (char (*) [13])SamplerSuffix);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_2f0.GLSLType,local_2c8,Token,4);
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x5e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1c8,(char (*) [2])0x6e9945,&local_2f0.GLSLType);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0.GLSLType._M_dataplus._M_p != &local_2f0.GLSLType.field_2) {
        operator_delete(local_2f0.GLSLType._M_dataplus._M_p,
                        local_2f0.GLSLType.field_2._M_allocated_capacity + 1);
      }
      if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
        operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
      }
    }
    iVar5 = std::__cxx11::string::compare((char *)&Token->_M_node[3]._M_prev);
    if (iVar5 == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&Token->_M_node[3]._M_prev,0,(char *)Token->_M_node[4]._M_next,0x7cf0ed);
    }
    local_230 = Token->_M_node;
    UVar12 = 0;
    for (local_250._M_current = (char *)local_230->_M_next;
        ((TokenListType *)local_250._M_current != this_00 &&
        (*(int *)&((_List_node_base *)((long)local_250._M_current + 0x10))->_M_next == 0x137));
        local_250._M_current = *local_250._M_current) {
      local_1c8._0_8_ =
           (this_00->
           super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           )._M_impl._M_node.super__List_node_base._M_next;
      local_2f0.GLSLType._M_dataplus._M_p = (pointer)this_00;
      local_250._M_current =
           (char *)Parsing::
                   FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                             ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)local_1c8,
                              (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&local_2f0,
                              local_250._M_current);
      if ((TokenListType *)local_250._M_current == this_00) {
        FormatString<char[48]>
                  ((string *)local_1c8,
                   (char (*) [48])"Unable to find matching closing square bracket.");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_2f0.GLSLType,local_2c8,
                   (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&local_250,4);
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessTextureDeclaration",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x5ff,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1c8,(char (*) [2])0x6e9945,&local_2f0.GLSLType);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0.GLSLType._M_dataplus._M_p != &local_2f0.GLSLType.field_2) {
          operator_delete(local_2f0.GLSLType._M_dataplus._M_p,
                          local_2f0.GLSLType.field_2._M_allocated_capacity + 1);
        }
        if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
          operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
        }
      }
      UVar12 = UVar12 + 1;
    }
    local_250._M_current = (char *)local_240;
    std::__cxx11::string::_M_construct<char*>((string *)&local_250,local_298,local_298 + local_290);
    if (bVar11 == 0) {
      local_1c8._0_8_ = local_1b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1c8,local_230[1]._M_prev,
                 (long)&(local_230[1]._M_prev)->_M_next + (long)local_230[2]._M_next);
      std::__cxx11::string::append((char *)local_1c8);
      this_01 = &((local_200->
                  super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish)->_M_h;
      do {
        if (this_01 ==
            &((local_200->
              super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start)->_M_h) goto LAB_002cc8ef;
        this_01 = this_01 + -1;
        cVar7 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(this_01,(key_type *)local_1c8);
      } while (cVar7.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
               ._M_cur == (__node_type *)0x0);
      if (*(char *)((long)cVar7.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
                          ._M_cur + 0x28) == '\x01') {
        std::__cxx11::string::append((char *)&local_250);
      }
LAB_002cc8ef:
      if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)local_1b8) {
        operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
      }
    }
    pp_Var1 = &local_2c0[1]._M_prev;
    SamplerSuffix = (char *)0x0;
    std::__cxx11::string::_M_replace((ulong)pp_Var1,0,(char *)local_2c0[2]._M_next,0x6e6688);
    if (local_258 == (Uint32 *)0x38) {
      std::__cxx11::string::_M_append((char *)pp_Var1,(ulong)local_278);
      std::__cxx11::string::append((char *)pp_Var1);
      if ((((bVar11 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_2b8), iVar5 != 0)
           ) && (iVar5 = std::__cxx11::string::compare((char *)&local_2b8), iVar5 != 0)) &&
         (iVar5 = std::__cxx11::string::compare((char *)&local_2b8), iVar5 != 0)) {
        std::__cxx11::string::append((char *)pp_Var1);
      }
    }
    std::__cxx11::string::_M_append((char *)pp_Var1,(ulong)local_250._M_current);
    HashMapStringKey::HashMapStringKey(&local_1d8,(Char *)local_230[1]._M_prev,true);
    uVar10 = local_2f4;
    local_2f0.GLSLType._M_dataplus._M_p = (pointer)&local_2f0.GLSLType.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f0,local_250._M_current,local_250._M_current + local_248);
    local_2f0.NumComponents = uVar10;
    local_2f0.ArrayDim = UVar12;
    std::pair<Diligent::HashMapStringKey,_Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>::
    pair<Diligent::HashMapStringKey,_Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo,_true>
              ((pair<Diligent::HashMapStringKey,_Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo> *
               )local_1c8,&local_1d8,&local_2f0);
    std::
    _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::HashMapStringKey,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>>
              (local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != &aStack_1a8) {
      operator_delete((void *)local_1b8._0_8_,aStack_1a8._M_allocated_capacity + 1);
    }
    if (((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)0x0) &&
       ((long)local_1c8._8_8_ < 0)) {
      operator_delete__((void *)local_1c8._0_8_);
    }
    local_1c8._0_8_ = (_List_node_base *)0x0;
    local_1c8._8_8_ = (char *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0.GLSLType._M_dataplus._M_p != &local_2f0.GLSLType.field_2) {
      operator_delete(local_2f0.GLSLType._M_dataplus._M_p,
                      local_2f0.GLSLType.field_2._M_allocated_capacity + 1);
    }
    if ((local_1d8.Str != (Char *)0x0) && ((long)local_1d8.Ownership_Hash < 0)) {
      operator_delete__(local_1d8.Str);
    }
    bVar4 = 1;
    if (local_258 == (Uint32 *)0x38) {
      while( true ) {
        p_Var9 = Token->_M_node;
        if (p_Var9 == (_List_node_base *)this_00) break;
        if (((ulong)p_Var9[1]._M_next & 0xfffffffe) == 0x13e) {
          if (p_Var9 != (_List_node_base *)this_00) {
            if (*(int *)&p_Var9[1]._M_next == 0x13f) {
              *(undefined4 *)&p_Var9[1]._M_next = 0x13e;
              SamplerSuffix = (char *)0x1;
              std::__cxx11::string::_M_replace
                        ((ulong)&p_Var9[1]._M_prev,0,(char *)p_Var9[2]._M_next,0x739949);
              __position._M_node = Token->_M_node->_M_next;
              Token->_M_node = __position._M_node;
              local_1f8 = &local_1e8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
              local_228 = &local_218;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"\n","");
              local_1c8._0_4_ = (int)local_208;
              local_1c8._8_8_ = local_1b8 + 8;
              aStack_1a8._8_8_ = &local_190;
              if (local_1f8 == &local_1e8) {
                aStack_1a8._M_allocated_capacity = sStack_1e0;
              }
              else {
                local_1c8._8_8_ = local_1f8;
              }
              uStack_1af = uStack_1e7;
              local_1b8[8] = local_1e8;
              local_1b8._0_8_ = local_1f0;
              local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0;
              local_1e8 = '\0';
              if (local_228 == &local_218) {
                local_190._8_8_ = local_218._8_8_;
              }
              else {
                aStack_1a8._8_8_ = local_228;
              }
              local_190._M_allocated_capacity._1_7_ = local_218._M_allocated_capacity._1_7_;
              local_190._M_local_buf[0] = local_218._M_local_buf[0];
              local_198 = local_220;
              local_220 = 0;
              local_218._M_local_buf[0] = '\0';
              local_180 = 0xffffffffffffffff;
              local_228 = &local_218;
              local_1f8 = &local_1e8;
              local_2c0 = (_List_node_base *)
                          std::__cxx11::
                          list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                          ::emplace<Diligent::Parsing::HLSLTokenInfo>
                                    (this_00,__position,(HLSLTokenInfo *)local_1c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)aStack_1a8._8_8_ != &local_190) {
                operator_delete((void *)aStack_1a8._8_8_,local_190._M_allocated_capacity + 1);
              }
              if ((undefined1 *)local_1c8._8_8_ != local_1b8 + 8) {
                operator_delete((void *)local_1c8._8_8_,stack0xfffffffffffffe50 + 1);
              }
              if (local_228 != &local_218) {
                operator_delete(local_228,
                                CONCAT71(local_218._M_allocated_capacity._1_7_,
                                         local_218._M_local_buf[0]) + 1);
              }
              if (local_1f8 != &local_1e8) {
                operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
              }
            }
            else {
              Token->_M_node = p_Var9->_M_next;
              bVar4 = 0;
            }
          }
          break;
        }
        iVar5 = std::__cxx11::string::compare((char *)&p_Var9[1]._M_prev);
        p_Var9 = Token->_M_node;
        if (iVar5 == 0) {
          while ((p_Var9 != (_List_node_base *)this_00 &&
                 (((ulong)p_Var9[1]._M_next & 0xfffffffe) != 0x13e))) {
            iVar2 = (iterator)Token->_M_node;
            Token->_M_node = (iVar2._M_node)->_M_next;
            std::__cxx11::
            list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
            ::_M_erase(this_00,iVar2);
            p_Var9 = Token->_M_node;
          }
        }
        else {
          Token->_M_node = p_Var9->_M_next;
        }
      }
    }
    if ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_250._M_current != local_240) {
      operator_delete(local_250._M_current,(ulong)(local_240[0]._M_current + 1));
    }
    if ((!(bool)(bVar4 & local_258 == (Uint32 *)0x38)) ||
       (Token->_M_node == (_List_node_base *)this_00)) {
      if (local_278 != (char (*) [39])&local_268) {
        operator_delete(local_278,CONCAT71(acStack_267._0_7_,local_268) + 1);
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,CONCAT71(uStack_287,local_288) + 1);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,CONCAT71(uStack_2a7,local_2a8) + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessTextureDeclaration(TokenListType::iterator&            Token,
                                                                         const std::vector<SamplerHashType>& Samplers,
                                                                         ObjectsTypeHashType&                Objects,
                                                                         const char*                         SamplerSuffix,
                                                                         Uint32&                             ImageBinding)
{
    auto TexDeclToken = Token;
    auto TextureDim   = TexDeclToken->Type;
    // Texture2D < float > ... ;
    // ^
    bool IsRWTexture =
        TextureDim == TokenType::kw_RWTexture1D ||
        TextureDim == TokenType::kw_RWTexture1DArray ||
        TextureDim == TokenType::kw_RWTexture2D ||
        TextureDim == TokenType::kw_RWTexture2DArray ||
        TextureDim == TokenType::kw_RWTexture3D ||
        TextureDim == TokenType::kw_RWBuffer;
    String ImgFormat;

    ++Token;
    // Texture2D < float > ... ;
    //           ^
#define CHECK_EOF() VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF in ", TexDeclToken->Literal, " declaration")
    CHECK_EOF();

    auto   TypeDefinitionStart = Token;
    String GLSLSampler;
    String LayoutQualifier;
    Uint32 NumComponents = 0;
    if (Token->Literal == "<")
    {
        // Fix token type
        VERIFY_EXPR(Token->Type == TokenType::ComparisonOp);
        Token->Type = TokenType::OpenAngleBracket;

        ++Token;
        CHECK_EOF();

        if (Token->Type == TokenType::kw_unorm)
        {
            // RWTexture2D < unorm float4 > ... ;
            //               ^
            ++Token;
            CHECK_EOF();
        }

        // Texture2D < float > ... ;
        //             ^
        auto TexFmtToken = Token;
        VERIFY_PARSER_STATE(Token, Token->IsBuiltInType(), "Texture format type must be built-in type");
        if (Token->Type >= TokenType::kw_float && Token->Type <= TokenType::kw_float4)
        {
            if (Token->Type == TokenType::kw_float)
                NumComponents = 1;
            else
                NumComponents = static_cast<int>(Token->Type) - static_cast<int>(TokenType::kw_float);
        }
        else if (Token->Type >= TokenType::kw_int && Token->Type <= TokenType::kw_int4)
        {
            GLSLSampler.push_back('i');
            if (Token->Type == TokenType::kw_int)
                NumComponents = 1;
            else
                NumComponents = static_cast<int>(Token->Type) - static_cast<int>(TokenType::kw_int);
        }
        else if (Token->Type >= TokenType::kw_uint && Token->Type <= TokenType::kw_uint4)
        {
            GLSLSampler.push_back('u');
            if (Token->Type == TokenType::kw_uint)
                NumComponents = 1;
            else
                NumComponents = static_cast<int>(Token->Type) - static_cast<int>(TokenType::kw_uint);
        }
        else
        {
            VERIFY_PARSER_STATE(Token, false, Token->Literal, " is not valid texture component type\n"
                                                              "Only the following texture element types are supported: float[1,2,3,4], int[1,2,3,4], uint[1,2,3,4]");
        }
        VERIFY_PARSER_STATE(Token, NumComponents >= 1 && NumComponents <= 4, "Between 1 and 4 components expected, ", NumComponents, " deduced");

        ++Token;
        CHECK_EOF();
        // Texture2D < float > ... ;
        //                   ^
        if ((TextureDim == TokenType::kw_Texture2DMS ||
             TextureDim == TokenType::kw_Texture2DMSArray) &&
            Token->Literal == ",")
        {
            // Texture2DMS < float, 4 > ... ;
            //                    ^
            ++Token;
            CHECK_EOF();
            // Texture2DMS < float, 4 > ... ;
            //                      ^
            // Texture2DMS < float, SAMPLE_COUNT > ... ;
            //                      ^
            VERIFY_PARSER_STATE(Token, Token->Type == TokenType::NumericConstant || Token->Type == TokenType::Identifier,
                                "Number of samples is expected in ", TexDeclToken->Literal, " declaration");

            // We do not really need the number of samples, so just skip it
            ++Token;
            CHECK_EOF();
            // Texture2DMS < float, 4 > ... ;
            //                        ^
        }
        VERIFY_PARSER_STATE(Token, Token->Literal == ">", "Missing \">\" in ", TexDeclToken->Literal, " declaration");
        // Fix token type
        VERIFY_EXPR(Token->Type == TokenType::ComparisonOp);
        Token->Type = TokenType::ClosingAngleBracket;

        if (IsRWTexture)
        {
            // RWTexture2D<float /* format = r32f */ >
            //                                       ^
            ImgFormat = Parsing::ExtractGLSLImageFormatFromComment(Token->Delimiter.begin(), Token->Delimiter.end());
            if (ImgFormat.length() == 0)
            {
                // RWTexture2D</* format = r32f */ float >
                //                                 ^
                //                            TexFmtToken
                ImgFormat = Parsing::ExtractGLSLImageFormatFromComment(TexFmtToken->Delimiter.begin(), TexFmtToken->Delimiter.end());
            }

            if (ImgFormat.length() != 0)
            {
                std::stringstream ss;
                ss << "layout(" << ImgFormat << ", binding=" << ImageBinding++ << ")";
                LayoutQualifier = ss.str();
            }
        }

        ++Token;
        // Texture2D < float > TexName ;
        //                     ^
        CHECK_EOF();
    }

    if (IsRWTexture)
        GLSLSampler.append("image");
    else
        GLSLSampler.append("sampler");

    switch (TextureDim)
    {
        // clang-format off
        case TokenType::kw_RWTexture1D:
        case TokenType::kw_Texture1D:          GLSLSampler += "1D";        break;

        case TokenType::kw_RWTexture1DArray:
        case TokenType::kw_Texture1DArray:     GLSLSampler += "1DArray";   break;

        case TokenType::kw_RWTexture2D:
        case TokenType::kw_Texture2D:          GLSLSampler += "2D";        break;

        case TokenType::kw_RWTexture2DArray:
        case TokenType::kw_Texture2DArray:     GLSLSampler += "2DArray";   break;

        case TokenType::kw_RWTexture3D:
        case TokenType::kw_Texture3D:          GLSLSampler += "3D";        break;

        case TokenType::kw_TextureCube:        GLSLSampler += "Cube";      break;
        case TokenType::kw_TextureCubeArray:   GLSLSampler += "CubeArray"; break;
        case TokenType::kw_Texture2DMS:        GLSLSampler += "2DMS";      break;
        case TokenType::kw_Texture2DMSArray:   GLSLSampler += "2DMSArray"; break;

        case TokenType::kw_RWBuffer:
        case TokenType::kw_Buffer:             GLSLSampler += "Buffer";    break;
        // clang-format on
        default: UNEXPECTED("Unexpected texture type");
    }

    //   TypeDefinitionStart
    //           |
    // Texture2D < float > TexName ;
    //                     ^
    m_Tokens.erase(TypeDefinitionStart, Token);
    // Texture2D TexName ;
    //           ^

    bool IsGlobalScope = Samplers.size() == 1;

    // There may be more than one texture variable declared in the same
    // statement:
    // Texture2D<float> g_Tex2D1, g_Tex2D1;
    do
    {
        // Texture2D TexName ;
        //           ^
        VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Identifier expected in ", TexDeclToken->Literal, " declaration");

        // Make sure there is a delimiter between sampler keyword and the
        // identifier. In cases like this
        // Texture2D<float>Name;
        // There will be no whitespace
        if (Token->Delimiter == "")
            Token->Delimiter = " ";

        // Texture2D TexName ;
        //           ^
        const auto& TextureName = Token->Literal;

        // Determine resource array dimensionality
        Uint32 ArrayDim = 0;
        {
            auto TmpToken = Token;
            ++TmpToken;
            while (TmpToken != m_Tokens.end() && TmpToken->Type == TokenType::OpenSquareBracket)
            {
                // Texture2D TexName[...][...]
                //                  ^
                TmpToken = Parsing::FindMatchingBracket(m_Tokens.begin(), m_Tokens.end(), TmpToken);
                VERIFY_PARSER_STATE(TmpToken, TmpToken != m_Tokens.end(), "Unable to find matching closing square bracket.");

                // Texture2D TexName[...][...]
                //                      ^

                ++ArrayDim;

                ++TmpToken;
                // Texture2D TexName[...][...]
                //                       ^
            }
        }

        auto CompleteGLSLSampler = GLSLSampler;
        if (!IsRWTexture)
        {
            // Try to find matching sampler
            auto SamplerName = TextureName + SamplerSuffix;
            // Search all scopes starting with the innermost
            for (auto ScopeIt = Samplers.rbegin(); ScopeIt != Samplers.rend(); ++ScopeIt)
            {
                auto SamplerIt = ScopeIt->find(SamplerName);
                if (SamplerIt != ScopeIt->end())
                {
                    if (SamplerIt->second)
                        CompleteGLSLSampler.append("Shadow");
                    break;
                }
            }
        }

        // TexDeclToken
        // |
        // Texture2D TexName ;
        //           ^
        TexDeclToken->Literal = "";
        if (IsGlobalScope)
        {
            // Use layout qualifier for global variables only, not for function arguments
            TexDeclToken->Literal.append(LayoutQualifier);
            // Samplers and images in global scope must be declared uniform.
            // Function arguments must not be declared uniform
            TexDeclToken->Literal.append("uniform ");
            // From GLES 3.1 spec:
            //    Except for image variables qualified with the format qualifiers r32f, r32i, and r32ui,
            //    image variables must specify either memory qualifier readonly or the memory qualifier writeonly.
            // So on GLES we have to assume that an image is a writeonly variable
            if (IsRWTexture && ImgFormat != "r32f" && ImgFormat != "r32i" && ImgFormat != "r32ui")
                TexDeclToken->Literal.append("IMAGE_WRITEONLY "); // defined as 'writeonly' on GLES and as '' on desktop in GLSLDefinitions.h
        }
        TexDeclToken->Literal.append(CompleteGLSLSampler);
        Objects.m.insert(std::make_pair(HashMapStringKey(TextureName), HLSLObjectInfo{std::move(CompleteGLSLSampler), NumComponents, ArrayDim}));

        // In global scope, multiple variables can be declared in the same statement
        if (IsGlobalScope)
        {
            // Texture2D TexName, TexName2 ;
            //           ^

            // Go to the next texture in the declaration or to the statement end, removing register declarations
            while (Token != m_Tokens.end() && Token->Type != TokenType::Comma && Token->Type != TokenType::Semicolon)
            {
                if (Token->Literal == ":")
                {
                    // Texture2D TexName : register(t0);
                    // Texture2D TexName : register(t0),
                    //                   ^

                    // Remove register
                    while (Token != m_Tokens.end() && Token->Type != TokenType::Comma && Token->Type != TokenType::Semicolon)
                    {
                        auto CurrToken = Token;
                        ++Token;
                        m_Tokens.erase(CurrToken);
                    }

                    // Texture2D TexName ,
                    //                   ^
                }
                else
                {
                    ++Token;
                }
            }

            if (Token != m_Tokens.end())
            {
                if (Token->Type == TokenType::Comma)
                {
                    // Texture2D TexName, TexName2 ;
                    //                  ^
                    Token->Type    = TokenType::Semicolon;
                    Token->Literal = ";";
                    // Texture2D TexName; TexName2 ;
                    //                  ^

                    ++Token;
                    // Texture2D TexName; TexName2 ;
                    //                    ^

                    // Insert empty token that will contain next sampler/image declaration
                    TexDeclToken = m_Tokens.insert(Token, TokenInfo(TextureDim, "", "\n"));
                    // Texture2D TexName;
                    // <Texture Declaration TBD> TexName2 ;
                    // ^                         ^
                    // TexDeclToken              Token
                }
                else
                {
                    // Texture2D TexName, TexName2 ;
                    //                             ^
                    ++Token;
                    break;
                }
            }
        }
    } while (IsGlobalScope && Token != m_Tokens.end());

#undef SKIP_DELIMITER
#undef CHECK_EOF
}